

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int gatherSelectWindowsCallback(Walker *pWalker,Expr *pExpr)

{
  char *in_RSI;
  Window *pWin;
  Select *pSelect;
  Window *in_stack_ffffffffffffffd8;
  
  if ((*in_RSI == -0x54) && ((*(uint *)(in_RSI + 4) & 0x1000000) != 0)) {
    sqlite3WindowLink(*(Select **)(in_RSI + 0x40),in_stack_ffffffffffffffd8);
  }
  return 0;
}

Assistant:

static int gatherSelectWindowsCallback(Walker *pWalker, Expr *pExpr){
  if( pExpr->op==TK_FUNCTION && ExprHasProperty(pExpr, EP_WinFunc) ){
    Select *pSelect = pWalker->u.pSelect;
    Window *pWin = pExpr->y.pWin;
    assert( pWin );
    assert( IsWindowFunc(pExpr) );
    assert( pWin->ppThis==0 );
    sqlite3WindowLink(pSelect, pWin);
  }
  return WRC_Continue;
}